

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varmap.cc
# Opt level: O1

void __thiscall AliasChecker::gather(AliasChecker *this,Funcdata *f,AddrSpace *spc,bool defer)

{
  pointer pAVar1;
  pointer puVar2;
  uint uVar3;
  
  this->fd = f;
  this->space = spc;
  this->calculated = false;
  pAVar1 = (this->addBase).
           super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->addBase).
      super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>._M_impl.
      super__Vector_impl_data._M_finish != pAVar1) {
    (this->addBase).
    super__Vector_base<AliasChecker::AddBase,_std::allocator<AliasChecker::AddBase>_>._M_impl.
    super__Vector_impl_data._M_finish = pAVar1;
  }
  puVar2 = (this->alias).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->alias).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->alias).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  uVar3 = (*spc->_vptr_AddrSpace[5])(spc);
  this->direction = (uVar3 & 0xff) - 1 | 1;
  deriveBoundaries(this,&this->fd->funcp);
  if (defer) {
    return;
  }
  gatherInternal(this);
  return;
}

Assistant:

void AliasChecker::gather(const Funcdata *f,AddrSpace *spc,bool defer)

{
  fd = f;
  space = spc;
  calculated = false;		// Defer calculation
  addBase.clear();
  alias.clear();
  direction = space->stackGrowsNegative() ? 1 : -1;		// direction == 1 for normal negative stack growth
  deriveBoundaries(fd->getFuncProto());
  if (!defer)
    gatherInternal();
}